

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_221c893::Target::DumpInclude
          (Value *__return_storage_ptr__,Target *this,IncludeEntry *inc)

{
  Value *pVVar1;
  ArrayIndex extraout_EDX;
  ArrayIndex extraout_EDX_00;
  JBTIndex bt;
  Value local_40;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_40,(String *)this);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"path");
  Json::Value::operator=(pVVar1,&local_40);
  Json::Value::~Value(&local_40);
  bt.Index = extraout_EDX;
  if ((this->TopSource).field_2._M_local_buf[8] == '\x01') {
    Json::Value::Value(&local_40,true);
    pVVar1 = Json::Value::operator[](__return_storage_ptr__,"isSystem");
    Json::Value::operator=(pVVar1,&local_40);
    Json::Value::~Value(&local_40);
    bt.Index = extraout_EDX_00;
  }
  AddBacktrace((Target *)__return_storage_ptr__,(Value *)(ulong)*(uint *)&(this->TopSource).field_2,
               bt);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpInclude(CompileData::IncludeEntry const& inc)
{
  Json::Value include = Json::objectValue;
  include["path"] = inc.Path.Value;
  if (inc.IsSystem) {
    include["isSystem"] = true;
  }
  this->AddBacktrace(include, inc.Path.Backtrace);
  return include;
}